

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_EveryoneWrites_Async.cpp
# Opt level: O1

int adios2::core::engine::BP5Writer::AsyncWriteThread_EveryoneWrites(AsyncWriteInfo *info)

{
  uint64_t totalsize;
  uint64_t t;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> DataVec;
  unsigned_long local_30;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> local_28;
  
  if ((info->tokenChain != (TokenChain<unsigned_long> *)0x0) && (0 < info->rank_chain)) {
    shm::TokenChain<unsigned_long>::RecvToken(info->tokenChain);
  }
  (*info->Data->_vptr_BufferV[2])(&local_28);
  totalsize = adios2::format::BufferV::Size(info->Data);
  AsyncWriteOwnData(info,&local_28,totalsize,true);
  if (info->tokenChain != (TokenChain<unsigned_long> *)0x0) {
    local_30 = 1;
    shm::TokenChain<unsigned_long>::SendToken(info->tokenChain,&local_30);
    if (info->rank_chain == 0) {
      shm::TokenChain<unsigned_long>::RecvToken(info->tokenChain);
    }
  }
  if (info->Data != (BufferV *)0x0) {
    (*info->Data->_vptr_BufferV[1])();
  }
  if (local_28.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return 1;
}

Assistant:

int BP5Writer::AsyncWriteThread_EveryoneWrites(AsyncWriteInfo *info)
{
    if (info->tokenChain)
    {
        if (info->rank_chain > 0)
        {
            info->tokenChain->RecvToken();
        }
    }

    std::vector<core::iovec> DataVec = info->Data->DataVec();
    const uint64_t mysize = info->Data->Size();
    AsyncWriteOwnData(info, DataVec, mysize, true);

    if (info->tokenChain)
    {
        uint64_t t = 1;
        info->tokenChain->SendToken(t);
        if (!info->rank_chain)
        {
            info->tokenChain->RecvToken();
        }
    }
    delete info->Data;
    return 1;
}